

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::MeanSquaredErrorLossLayer::CopyFrom
          (MeanSquaredErrorLossLayer *this,MeanSquaredErrorLossLayer *from)

{
  void *pvVar1;
  string *psVar2;
  string *psVar3;
  LogMessage *other;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from == this) {
    return;
  }
  psVar3 = (this->input_).ptr_;
  if (psVar3 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    psVar3->_M_string_length = 0;
    *(psVar3->_M_dataplus)._M_p = '\0';
  }
  psVar3 = (this->target_).ptr_;
  if (psVar3 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    psVar3->_M_string_length = 0;
    *(psVar3->_M_dataplus)._M_p = '\0';
    MergeFrom(this,from);
    return;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x12154);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  psVar3 = (from->input_).ptr_;
  if ((psVar3->_M_string_length != 0) && (psVar2 = (this->input_).ptr_, psVar2 != psVar3)) {
    if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->input_,psVar3);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar2);
    }
  }
  psVar3 = (from->target_).ptr_;
  if ((psVar3->_M_string_length != 0) && (psVar2 = (this->target_).ptr_, psVar2 != psVar3)) {
    if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->target_,psVar3);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar2);
    }
  }
  return;
}

Assistant:

void MeanSquaredErrorLossLayer::CopyFrom(const MeanSquaredErrorLossLayer& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.MeanSquaredErrorLossLayer)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}